

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

size_t __thiscall YAML::detail::node_data::size(node_data *this)

{
  size_t sVar1;
  
  if (this->m_isDefined == true) {
    if (this->m_type == Map) {
      compute_map_size(this);
      sVar1 = ((long)(this->m_map).
                     super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_map).
                     super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) -
              (this->m_undefinedPairs).
              super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
              ._M_impl._M_node._M_size;
    }
    else if (this->m_type == Sequence) {
      compute_seq_size(this);
      sVar1 = this->m_seqSize;
    }
    else {
      sVar1 = 0;
    }
    return sVar1;
  }
  return 0;
}

Assistant:

std::size_t node_data::size() const {
  if (!m_isDefined)
    return 0;

  switch (m_type) {
    case NodeType::Sequence:
      compute_seq_size();
      return m_seqSize;
    case NodeType::Map:
      compute_map_size();
      return m_map.size() - m_undefinedPairs.size();
    default:
      return 0;
  }
  return 0;
}